

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Skin::Skin(Skin *this,uint64_t id,Element *element,Document *doc,string *name)

{
  Scope *this_00;
  Element *el;
  Token *t;
  _Alloc_hider _Var1;
  float fVar2;
  Cluster *cluster;
  Cluster *local_60;
  string local_58;
  Skin *local_38;
  
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__Skin_00246078;
  this->accuracy = 0.0;
  (this->clusters).
  super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clusters).
  super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clusters).
  super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  this_00 = GetRequiredScope(element);
  std::__cxx11::string::string((string *)&local_58,"Link_DeformAcuracy",(allocator *)&local_60);
  el = Scope::operator[](this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (el != (Element *)0x0) {
    t = GetRequiredToken(el,0);
    fVar2 = ParseTokenAsFloat(t);
    this->accuracy = fVar2;
  }
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_58,doc,(this->super_Deformer).super_Object.id,"Deformer");
  std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>::reserve
            (&this->clusters,
             (long)(local_58._M_string_length - (long)local_58._M_dataplus._M_p) >> 3);
  for (_Var1._M_p = local_58._M_dataplus._M_p; _Var1._M_p != (pointer)local_58._M_string_length;
      _Var1._M_p = _Var1._M_p + 8) {
    local_60 = Util::ProcessSimpleConnection<Assimp::FBX::Cluster>
                         (*(Connection **)_Var1._M_p,false,"Cluster -> Skin",element,(char **)0x0);
    if (local_60 != (Cluster *)0x0) {
      std::vector<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>::
      push_back(&this->clusters,&local_60);
    }
  }
  std::
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~_Vector_base((_Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&local_58);
  return;
}

Assistant:

Skin::Skin(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Deformer(id,element,doc,name)
, accuracy( 0.0f ) {
    const Scope& sc = GetRequiredScope(element);

    const Element* const Link_DeformAcuracy = sc["Link_DeformAcuracy"];
    if(Link_DeformAcuracy) {
        accuracy = ParseTokenAsFloat(GetRequiredToken(*Link_DeformAcuracy,0));
    }

    // resolve assigned clusters
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"Deformer");

    clusters.reserve(conns.size());
    for(const Connection* con : conns) {

        const Cluster* const cluster = ProcessSimpleConnection<Cluster>(*con, false, "Cluster -> Skin", element);
        if(cluster) {
            clusters.push_back(cluster);
            continue;
        }
    }
}